

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::OneHotEncoder::clear_CategoryType(OneHotEncoder *this)

{
  StringVector *this_00;
  Int64Vector *this_01;
  CategoryTypeCase CVar1;
  Arena *pAVar2;
  OneHotEncoder *this_local;
  
  CVar1 = CategoryType_case(this);
  if (CVar1 != CATEGORYTYPE_NOT_SET) {
    if (CVar1 == kStringCategories) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_00 = (this->CategoryType_).stringcategories_, this_00 != (StringVector *)0x0)) {
        StringVector::~StringVector(this_00);
        operator_delete(this_00,0x30);
      }
    }
    else if (((CVar1 == kInt64Categories) &&
             (pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation
                                 (&this->super_MessageLite), pAVar2 == (Arena *)0x0)) &&
            (this_01 = (this->CategoryType_).int64categories_, this_01 != (Int64Vector *)0x0)) {
      Int64Vector::~Int64Vector(this_01);
      operator_delete(this_01,0x28);
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void OneHotEncoder::clear_CategoryType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.OneHotEncoder)
  switch (CategoryType_case()) {
    case kStringCategories: {
      if (GetArenaForAllocation() == nullptr) {
        delete CategoryType_.stringcategories_;
      }
      break;
    }
    case kInt64Categories: {
      if (GetArenaForAllocation() == nullptr) {
        delete CategoryType_.int64categories_;
      }
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CATEGORYTYPE_NOT_SET;
}